

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O2

unsigned_fast_type
math::wide_integer::lsb<128u,unsigned_short,void,false>
          (uintwide_t<128U,_unsigned_short,_void,_false> *x)

{
  unsigned_fast_type uVar1;
  long lVar2;
  
  lVar2 = 0;
  while( true ) {
    if (lVar2 == -0x80) {
      return 0;
    }
    if (*(value_type_conflict3 *)x != 0) break;
    lVar2 = lVar2 + -0x10;
    x = (uintwide_t<128U,_unsigned_short,_void,_false> *)((long)x + 2);
  }
  uVar1 = detail::lsb_helper<unsigned_short>((unsigned_short *)x);
  return uVar1 - lVar2;
}

Assistant:

constexpr auto lsb(const uintwide_t<Width2, LimbType, AllocatorType, IsSigned>& x) -> unsigned_fast_type
  {
    // Calculate the position of the least-significant bit.
    // Use a linear search starting from the least significant limb.

    using local_wide_integer_type = uintwide_t<Width2, LimbType, AllocatorType, IsSigned>;
    using local_value_type        = typename local_wide_integer_type::representation_type::value_type;

    auto bpos   = static_cast<unsigned_fast_type>(UINT8_C(0));
    auto offset = static_cast<unsigned_fast_type>(UINT8_C(0));

    for(auto it = x.crepresentation().cbegin(); it != x.crepresentation().cend(); ++it, ++offset) // NOLINT(llvm-qualified-auto,readability-qualified-auto,altera-id-dependent-backward-branch)
    {
      const auto vi = static_cast<local_value_type>(*it & (std::numeric_limits<local_value_type>::max)());

      if(vi != static_cast<local_value_type>(UINT8_C(0)))
      {
        bpos =
          static_cast<unsigned_fast_type>
          (
              detail::lsb_helper(*it)
            + static_cast<unsigned_fast_type>
              (
                static_cast<unsigned_fast_type>(std::numeric_limits<local_value_type>::digits) * offset
              )
          );

        break;
      }
    }

    return bpos;
  }